

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TarjanAnalysis.h
# Opt level: O1

void __thiscall
dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis
          (TarjanAnalysis<dg::llvmdg::legacy::Block> *this)

{
  void *pvVar1;
  void *pvVar2;
  _Rb_tree_node_base *p_Var3;
  
  for (p_Var3 = (this->components_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->components_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pvVar1 = *(void **)(p_Var3 + 1);
    if (pvVar1 != (void *)0x0) {
      std::
      _Rb_tree<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::_Identity<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
      ::_M_erase((_Rb_tree<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::_Identity<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
                  *)((long)pvVar1 + 0x50),*(_Link_type *)((long)pvVar1 + 0x60));
      std::
      _Rb_tree<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::_Identity<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
      ::_M_erase((_Rb_tree<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::_Identity<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
                  *)((long)pvVar1 + 0x20),*(_Link_type *)((long)pvVar1 + 0x30));
      pvVar2 = *(void **)((long)pvVar1 + 8);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x18) - (long)pvVar2);
      }
      operator_delete(pvVar1,0x80);
    }
  }
  std::
  _Rb_tree<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::_Identity<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  ::_M_erase(&(this->components_)._M_t,
             (_Link_type)(this->components_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  std::
  _Hashtable<dg::llvmdg::legacy::Block_*,_std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node>_>,_std::__detail::_Select1st,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::hash<dg::llvmdg::legacy::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->nodeInfo)._M_h);
  std::_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>::
  ~_Deque_base((_Deque_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                *)&this->stack);
  return;
}

Assistant:

~TarjanAnalysis() {
        for (auto component : components_) {
            delete component;
        }
    }